

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

void RecursiveTreeCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt group_rank,IceTInt image_dest,
               IceTSparseImage *imageData,IceTVoid *inSparseImageBuffer,IceTSparseImage *imageBuffer
               )

{
  IceTVoid *pIVar1;
  bool bVar2;
  bool bVar3;
  IceTEnum color_format;
  IceTEnum depth_format;
  IceTSizeType IVar4;
  IceTSizeType height;
  IceTSparseImage front_buffer;
  IceTSparseImage back_buffer;
  uint uVar5;
  uint group_size_00;
  IceTSizeType package_size;
  IceTVoid *package_buffer;
  IceTSizeType local_3c;
  void *local_38;
  
  if (group_size < 2) {
    return;
  }
  group_size_00 = (uint)group_size >> 1;
  if (group_rank < (int)group_size_00) {
    RecursiveTreeCompose
              (compose_group,group_size_00,group_rank,image_dest,imageData,inSparseImageBuffer,
               imageBuffer);
    uVar5 = group_size_00;
    if (group_rank == image_dest) {
      bVar3 = true;
    }
    else {
      if (group_size_00 <= (uint)image_dest && group_rank == 0) {
        if (image_dest < (int)group_size_00 || group_size <= image_dest) {
          bVar3 = true;
          bVar2 = false;
          goto LAB_001191db;
        }
LAB_001191c6:
        bVar2 = true;
        bVar3 = false;
        uVar5 = image_dest;
        goto LAB_001191db;
      }
      bVar3 = false;
      uVar5 = 0xffffffff;
    }
  }
  else {
    RecursiveTreeCompose
              (compose_group + group_size_00,group_size - group_size_00,group_rank - group_size_00,
               image_dest - group_size_00,imageData,inSparseImageBuffer,imageBuffer);
    if (group_rank == image_dest) {
      bVar3 = true;
      uVar5 = 0;
    }
    else {
      uVar5 = 0xffffffff;
      if (group_rank == group_size_00) {
        bVar2 = false;
        bVar3 = false;
        if ((int)group_size_00 <= image_dest && image_dest < group_size) goto LAB_001191db;
        if (group_size_00 <= (uint)image_dest) {
          image_dest = 0;
        }
        goto LAB_001191c6;
      }
      bVar3 = false;
    }
  }
  bVar2 = false;
LAB_001191db:
  if (bVar2) {
    icetSparseImagePackageForSend((IceTSparseImage)imageData->opaque_internals,&local_38,&local_3c);
    icetCommSend(local_38,local_3c,0x8001,compose_group[(int)uVar5],0x17);
  }
  else if (bVar3) {
    color_format = icetSparseImageGetColorFormat((IceTSparseImage)imageData->opaque_internals);
    depth_format = icetSparseImageGetDepthFormat((IceTSparseImage)imageData->opaque_internals);
    IVar4 = icetSparseImageGetWidth((IceTSparseImage)imageData->opaque_internals);
    height = icetSparseImageGetHeight((IceTSparseImage)imageData->opaque_internals);
    IVar4 = icetSparseImageBufferSizeType(color_format,depth_format,IVar4,height);
    icetCommRecv(inSparseImageBuffer,IVar4,0x8001,compose_group[(int)uVar5],0x17);
    front_buffer = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
    back_buffer.opaque_internals = imageData->opaque_internals;
    if (group_rank < (int)uVar5) {
      back_buffer = front_buffer;
      front_buffer.opaque_internals = imageData->opaque_internals;
    }
    icetCompressedCompressedComposite
              (front_buffer,back_buffer,(IceTSparseImage)imageBuffer->opaque_internals);
    pIVar1 = imageData->opaque_internals;
    imageData->opaque_internals = imageBuffer->opaque_internals;
    imageBuffer->opaque_internals = pIVar1;
  }
  return;
}

Assistant:

static void RecursiveTreeCompose(const IceTInt *compose_group,
                                 IceTInt group_size,
                                 IceTInt group_rank,
                                 IceTInt image_dest,
                                 IceTSparseImage *imageData,
                                 IceTVoid *inSparseImageBuffer,
                                 IceTSparseImage *imageBuffer)
{
    IceTInt middle;
    enum { NO_IMAGE, SEND_IMAGE, RECV_IMAGE } current_image;
    IceTInt pair_proc;

    if (group_size <= 1) return;

  /* Build composite tree by splitting down middle. */
  /* If middle is in a group, then the image is sent there, otherwise the
   * image is sent to the processor of group_rank 0 (for that subgroup). */
    middle = group_size/2;
    if (group_rank < middle) {
        RecursiveTreeCompose(compose_group, middle, group_rank, image_dest,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = middle;
        } else if (   (group_rank == 0)
                   && ((image_dest < 0) || (image_dest >= middle)) ) {
          /* I have an image by default. */
            if ((image_dest >= middle) && (image_dest < group_size)) {
              /* Opposite subtree has destination.  Hand it over. */
                current_image = SEND_IMAGE;
                pair_proc = image_dest;
            } else {
              /* Opposite subtree does not have destination either.  Give
                 to me by default. */
                current_image = RECV_IMAGE;
                pair_proc = middle;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    } else {
        RecursiveTreeCompose(compose_group + middle, group_size - middle,
                             group_rank - middle, image_dest - middle,
                             imageData, inSparseImageBuffer, imageBuffer);
        if (group_rank == image_dest) {
          /* I'm the destination.  GIMME! */
            current_image = RECV_IMAGE;
            pair_proc = 0;
        } else if (   (group_rank == middle)
                   && ((image_dest < middle) || (image_dest >= group_size)) ) {
          /* I have an image by default. */
            current_image = SEND_IMAGE;
            if ((image_dest >= 0) && (image_dest < middle)) {
                pair_proc = image_dest;
            } else {
                pair_proc = 0;
            }
        } else {
          /* I don't even have an image anymore. */
            current_image = NO_IMAGE;
            pair_proc = -1;
        }
    }

    if (current_image == SEND_IMAGE) {
      /* Hasta la vista, baby. */
        IceTVoid *package_buffer;
        IceTSizeType package_size;
        icetRaiseDebug1("Sending image to %d", (int)compose_group[pair_proc]);
        icetSparseImagePackageForSend(*imageData,
                                      &package_buffer,
                                      &package_size);
        icetCommSend(package_buffer, package_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
    } else if (current_image == RECV_IMAGE) {
      /* Get my image. */
        IceTSparseImage inSparseImage;
        IceTSizeType incoming_size;
        icetRaiseDebug1("Getting image from %d", (int)compose_group[pair_proc]);
        incoming_size = icetSparseImageBufferSizeType(
                                      icetSparseImageGetColorFormat(*imageData),
                                      icetSparseImageGetDepthFormat(*imageData),
                                      icetSparseImageGetWidth(*imageData),
                                      icetSparseImageGetHeight(*imageData));
        icetCommRecv(inSparseImageBuffer, incoming_size, ICET_BYTE,
                     compose_group[pair_proc], TREE_IMAGE_DATA);
        inSparseImage
            = icetSparseImageUnpackageFromReceive(inSparseImageBuffer);
        if (group_rank < pair_proc) {
            icetCompressedCompressedComposite(*imageData,
                                              inSparseImage,
                                              *imageBuffer);
        } else {
            icetCompressedCompressedComposite(inSparseImage,
                                              *imageData,
                                              *imageBuffer);
        }
        /* The actual image data is now in imageBuffer, so switch imageBuffer
           and imageData. */
        {
            IceTSparseImage oldImage = *imageData;
            *imageData = *imageBuffer;
            *imageBuffer = oldImage;
        }
    }
}